

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_view_suite.cpp
# Opt level: O1

void fixed_api_suite::api_insert_value(void)

{
  long lVar1;
  pair<int,_int> array [4];
  undefined8 *local_58;
  undefined8 *local_50;
  undefined8 local_48 [4];
  
  lVar1 = 0;
  do {
    *(undefined8 *)((long)local_48 + lVar1) = 0;
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  local_58 = (undefined8 *)0x0;
  local_50 = (undefined8 *)((ulong)local_50 & 0xffffffff00000000);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0xfa,"void fixed_api_suite::api_insert_value()",&local_58,&local_50);
  local_58 = local_48;
  local_48[0] = 0x10000000b;
  local_50 = local_58;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,vista::pair<int,int>*,vista::pair<int,int>*>
            ("span.insert({ 11, 1 })","span.begin()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0xfb,"void fixed_api_suite::api_insert_value()",&local_58,&local_50);
  local_58 = (undefined8 *)0x1;
  local_50 = (undefined8 *)CONCAT44(local_50._4_4_,1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("span.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/map_view_suite.cpp"
             ,0xfc,"void fixed_api_suite::api_insert_value()",&local_58,&local_50);
  return;
}

Assistant:

void api_insert_value()
{
    pair<int, int> array[4] = {};
    map_view<int, int, 4> span(array);
    BOOST_TEST_EQ(span.size(), 0);
    BOOST_TEST_EQ(span.insert({ 11, 1 }), span.begin());
    BOOST_TEST_EQ(span.size(), 1);
}